

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O3

void math::internal::matrix_apply_householder_matrix<double>
               (double *mat_a,int rows,int cols,double *house_mat,int house_length,int offset_rows,
               int offset_cols)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [8];
  int iVar4;
  ulong uVar5;
  double *pdVar6;
  uint uVar7;
  double dVar8;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> rhs;
  allocator_type local_35;
  int local_34;
  
  uVar7 = (cols - rows) + house_length;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = rows;
  local_34 = cols;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,(long)(int)(uVar7 * house_length),
             &local_35);
  if (0 < house_length) {
    iVar4 = offset_rows * local_34 + offset_cols;
    uVar5 = 0;
    auVar3 = local_68;
    do {
      if (0 < (int)uVar7) {
        uVar2 = 0;
        do {
          *(double *)((long)auVar3 + uVar2 * 8) = mat_a[iVar4 + (int)uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar7 != uVar2);
      }
      uVar5 = uVar5 + 1;
      auVar3 = (undefined1  [8])((long)auVar3 + (long)(int)uVar7 * 8);
      iVar4 = iVar4 + local_34;
    } while (uVar5 != (uint)house_length);
  }
  if (rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ - offset_rows != 0 &&
      offset_rows <=
      rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_) {
    uVar5 = 0;
    do {
      if (0 < local_34 - offset_cols) {
        uVar2 = 0;
        auVar3 = local_68;
        do {
          dVar8 = 0.0;
          if (0 < house_length) {
            uVar1 = 0;
            pdVar6 = (double *)auVar3;
            do {
              dVar8 = dVar8 + house_mat[uVar1] * *pdVar6;
              uVar1 = uVar1 + 1;
              pdVar6 = pdVar6 + (int)uVar7;
            } while ((uint)house_length != uVar1);
          }
          mat_a[((int)uVar5 + offset_rows) * local_34 + offset_cols + (int)uVar2] = dVar8;
          uVar2 = uVar2 + 1;
          auVar3 = (undefined1  [8])((long)auVar3 + 8);
        } while (uVar2 != (uint)(local_34 - offset_cols));
      }
      uVar5 = uVar5 + 1;
      house_mat = house_mat + house_length;
    } while (uVar5 != (uint)(rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_ - offset_rows));
  }
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68);
  }
  return;
}

Assistant:

void
matrix_apply_householder_matrix (T* mat_a, int rows, int cols,
    T const* house_mat, int house_length, int offset_rows, int offset_cols)
{
    /* Save block from old matrix that will be modified. */
    int house_length_n = house_length - (rows - cols);
    std::vector<T> rhs(house_length * house_length_n);
    for (int i = 0; i < house_length; ++i)
    {
        for (int j = 0; j < house_length_n; ++j)
        {
            rhs[i * house_length_n + j] = mat_a[(offset_rows + i) *
                cols + (offset_cols + j)];
        }
    }

    /* Multiply block matrices. */
    for (int i = 0; i < (rows - offset_rows); ++i)
    {
        for (int j = 0; j < (cols - offset_cols); ++j)
        {
            T current(0);
            for (int k = 0; k < house_length; ++k)
            {
                current += (house_mat[i * house_length + k] *
                    rhs[k * house_length_n + j]);
            }
            mat_a[(offset_rows + i) * cols + (offset_cols + j)] = current;
        }
    }
}